

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O3

Builder * embree::BVH8BuilderTwoLevelInstanceSAH_error
                    (void *param_1,Scene *param_2,GTypeMask param_3,bool param_4)

{
  undefined8 *puVar1;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"function BVH8BuilderTwoLevelInstanceSAH not supported by your CPU"
             ,"");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 5;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

BVH8Factory::BVH8Factory(int bfeatures, int ifeatures)
  {
    SELECT_SYMBOL_INIT_AVX(ifeatures,BVH8ColliderUserGeom);
    
    selectBuilders(bfeatures);
    selectIntersectors(ifeatures);
  }